

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toc.c
# Opt level: O1

uint8_t cueify_toc_get_track_sub_q_channel_format(cueify_toc *t,uint8_t track)

{
  cueify_toc_private *toc;
  uint8_t *puVar1;
  
  if (t == (cueify_toc *)0x0) {
    return '\0';
  }
  if ((track < *(byte *)t) || (*(byte *)((long)t + 1) < track)) {
    if (track != 0xaa) {
      return '\0';
    }
    puVar1 = (uint8_t *)((long)t + 4);
  }
  else {
    puVar1 = (uint8_t *)((long)t + (ulong)track * 8 + 4);
  }
  return *puVar1;
}

Assistant:

uint8_t cueify_toc_get_track_sub_q_channel_format(cueify_toc *t,
						  uint8_t track) {
    cueify_toc_private *toc = (cueify_toc_private *)t;

    if (toc == NULL) {
	return 0;
    } else if (track >= toc->first_track_number &&
	       track <= toc->last_track_number) {
	return toc->tracks[track].adr;
    } else if (track == CUEIFY_LEAD_OUT_TRACK) {
	return toc->tracks[0].adr;
    } else {
	return 0;
    }
}